

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

int xmlLoadCatalog(char *filename)

{
  int iVar1;
  xmlCatalogPtr pxVar2;
  
  if (xmlCatalogInitialized == '\0') {
    xmlInitializeCatalogData();
  }
  xmlRMutexLock(xmlCatalogMutex);
  if (xmlDefaultCatalog == (xmlCatalogPtr)0x0) {
    pxVar2 = xmlLoadACatalog(filename);
    if (pxVar2 == (xmlCatalogPtr)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = 0;
      xmlDefaultCatalog = pxVar2;
    }
  }
  else {
    iVar1 = xmlExpandCatalog(xmlDefaultCatalog,filename);
  }
  xmlRMutexUnlock(xmlCatalogMutex);
  return iVar1;
}

Assistant:

int
xmlLoadCatalog(const char *filename)
{
    int ret;
    xmlCatalogPtr catal;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalogData();

    xmlRMutexLock(xmlCatalogMutex);

    if (xmlDefaultCatalog == NULL) {
	catal = xmlLoadACatalog(filename);
	if (catal == NULL) {
	    xmlRMutexUnlock(xmlCatalogMutex);
	    return(-1);
	}

	xmlDefaultCatalog = catal;
	xmlRMutexUnlock(xmlCatalogMutex);
	return(0);
    }

    ret = xmlExpandCatalog(xmlDefaultCatalog, filename);
    xmlRMutexUnlock(xmlCatalogMutex);
    return(ret);
}